

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          *lhs,vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               *rhs)

{
  set<int,_std::less<int>,_std::allocator<int>_> *__first1;
  set<int,_std::less<int>,_std::allocator<int>_> *__last1;
  set<int,_std::less<int>,_std::allocator<int>_> *__first2;
  bool bVar1;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  __first1 = (lhs->
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  __last1 = (lhs->
            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  __first2 = (rhs->
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  if ((long)__last1 - (long)__first1 ==
      (long)(rhs->
            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)__first2) {
    bVar1 = std::__equal<false>::
            equal<std::set<int,std::less<int>,std::allocator<int>>const*,std::set<int,std::less<int>,std::allocator<int>>const*>
                      (__first1,__last1,__first2);
    if (bVar1) {
      AVar3 = AssertionSuccess();
      sVar2 = AVar3.message_.ptr_;
      goto LAB_00116860;
    }
  }
  AVar3 = CmpHelperEQFailure<std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>,std::vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>>
                    (this,lhs_expression,rhs_expression,lhs,rhs);
  sVar2 = AVar3.message_.ptr_;
LAB_00116860:
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}